

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O1

int __thiscall catalog::existTable(catalog *this,string *tableName)

{
  int iVar1;
  pointer ppTVar2;
  size_t sVar3;
  TableInfo *pTVar4;
  size_t __n;
  int iVar5;
  long lVar6;
  
  iVar1 = this->tableNumber;
  if (0 < (long)iVar1) {
    ppTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar3 = tableName->_M_string_length;
    lVar6 = 0;
    do {
      pTVar4 = ppTVar2[lVar6];
      __n = (pTVar4->tableName)._M_string_length;
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar5 = bcmp((pTVar4->tableName)._M_dataplus._M_p,(tableName->_M_dataplus)._M_p,__n),
          iVar5 == 0)))) {
        return (int)lVar6;
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  return -1;
}

Assistant:

int catalog::existTable(std::string tableName){
    for(int i = 0 ; i < tableNumber ; i++){
        // std::cout << "check "<<tableName<<std::endl;
        // std::cout << "find "<<TableInfoList[i]->tableName<<std::endl;
        if(TableInfoList[i]->tableName == tableName){
            return i;
        }
    }
    return -1;
}